

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

void phmap::priv::(anonymous_namespace)::CheckPairEquals<std::__cxx11::string,std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *y)

{
  __type _Var1;
  
  _Var1 = std::operator==(x,y);
  if (_Var1) {
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                ,0x49,
                "void phmap::priv::(anonymous namespace)::CheckPairEquals(const T &, const U &) [T = std::basic_string<char>, U = std::basic_string<char>]"
               );
}

Assistant:

void CheckPairEquals(const T &x, const U &y) {
        PHMAP_INTERNAL_CHECK(x == y, "Values are unequal.");
    }